

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderIndexingCase::init(ShaderIndexingCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  if (((this->m_requirements & 1) == 0) &&
     ((((this->m_requirements & 2) == 0 ||
       (iVar1 = (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[5])(),
       (char)iVar1 != '\0')) && ((this->m_requirements & 4) != 0)))) {
    (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[8])();
  }
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderIndexingCase::init (void)
{
	const bool isSupported = !(m_requirements & REQUIREMENT_UNIFORM_INDEXING) &&
							 (!(m_requirements & REQUIREMENT_VERTEX_UNIFORM_LOOPS) || m_ctxInfo.isVertexUniformLoopSupported()) &&
							 (!(m_requirements & REQUIREMENT_FRAGMENT_UNIFORM_LOOPS) || m_ctxInfo.isFragmentUniformLoopSupported());

	try
	{
		ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (!isSupported)
			throw tcu::NotSupportedError("Shader is not supported");
		else
			throw;
	}
}